

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpeg_stream_reader.cpp
# Opt level: O3

void __thiscall charls::jpeg_stream_reader::read_comment_segment(jpeg_stream_reader *this)

{
  _func_int_void_ptr_unsigned_long_void_ptr *p_Var1;
  iterator puVar2;
  int iVar3;
  iterator puVar4;
  
  p_Var1 = (this->at_comment_callback_).handler;
  if (p_Var1 != (_func_int_void_ptr_unsigned_long_void_ptr *)0x0) {
    puVar2 = (iterator)(this->segment_data_).size_;
    puVar4 = puVar2;
    if (puVar2 != (iterator)0x0) {
      puVar4 = this->position_;
    }
    iVar3 = (*p_Var1)(puVar4,(unsigned_long)puVar2,(this->at_comment_callback_).user_context);
    if (iVar3 != 0) {
      read_comment_segment();
    }
  }
  skip_remaining_segment_data(this);
  return;
}

Assistant:

void jpeg_stream_reader::read_comment_segment()
{
    if (at_comment_callback_.handler &&
        UNLIKELY(static_cast<bool>(at_comment_callback_.handler(segment_data_.empty() ? nullptr : position_,
                                                                segment_data_.size(), at_comment_callback_.user_context))))
        throw_jpegls_error(jpegls_errc::callback_failed);

    skip_remaining_segment_data();
}